

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parameter.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall
ezc3d::ParametersNS::GroupNS::Parameter::valuesAsInt(Parameter *this)

{
  invalid_argument *this_00;
  long in_RDI;
  string local_28 [8];
  char *in_stack_ffffffffffffffe0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe8;
  
  if ((((*(byte *)(in_RDI + 0x60) & 1) == 0) && (*(int *)(in_RDI + 0x44) != 2)) &&
     (*(int *)(in_RDI + 0x44) != 1)) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::operator+(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
    std::invalid_argument::invalid_argument(this_00,local_28);
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  return (vector<int,_std::allocator<int>_> *)(in_RDI + 0x68);
}

Assistant:

const std::vector<int> &
ezc3d::ParametersNS::GroupNS::Parameter::valuesAsInt() const {
  if (!_isEmpty && _data_type != DATA_TYPE::INT &&
      _data_type != DATA_TYPE::BYTE)
    throw std::invalid_argument(_name + " parameter is not an INT");
  return _param_data_int;
}